

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.h
# Opt level: O0

void __thiscall
Triangle::Triangle(Triangle *this,Vector3f *a,Vector3f *b,Vector3f *c,Vector3f *p,Vector3f *q,
                  Vector3f *r,Material *m)

{
  Vector3f *pVVar1;
  float *pfVar2;
  bool bVar3;
  uint uVar4;
  Object *in_RDI;
  float fVar5;
  Triangle *unaff_retaddr;
  Material *in_stack_00000010;
  int *this_00;
  Vector3f *local_b8;
  Vector3f *this_01;
  int *this_02;
  Vector3f *v0;
  float *local_80;
  
  Object::Object(in_RDI,in_stack_00000010);
  in_RDI->_vptr_Object = (_func_int **)&PTR_intersect_003d2aa8;
  *(undefined1 *)&in_RDI[1]._vptr_Object = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_Object + 2) = 0;
  v0 = (Vector3f *)((long)&in_RDI[2]._vptr_Object + 4);
  pfVar2 = (float *)((long)&in_RDI[1]._vptr_Object + 4);
  do {
    local_80 = pfVar2;
    Vector2f::Vector2f((Vector2f *)local_80,0.0);
    pfVar2 = local_80 + 2;
  } while ((Vector3f *)(local_80 + 2) != v0);
  this_02 = &in_RDI[2].remit;
  this_01 = (Vector3f *)((long)&in_RDI[3].m + 4);
  do {
    Vector3f::Vector3f((Vector3f *)this_02,0.0);
    this_02 = this_02 + 3;
  } while ((Vector3f *)this_02 != this_01);
  this_00 = &in_RDI[5].remit;
  pVVar1 = (Vector3f *)((long)&in_RDI[3].m + 4);
  do {
    local_b8 = pVVar1;
    Vector3f::Vector3f(local_b8,0.0);
    pVVar1 = local_b8 + 1;
  } while (local_b8 + 1 != (Vector3f *)this_00);
  Vector3f::Vector3f((Vector3f *)&in_RDI[5].remit,0.0);
  Matrix3f::Matrix3f((Matrix3f *)((long)&in_RDI[5].m + 4),0.0);
  Vector3f::operator=((Vector3f *)this_00,local_b8);
  Vector3f::operator=((Vector3f *)this_00,local_b8);
  Vector3f::operator=((Vector3f *)this_00,local_b8);
  ::operator-((Vector3f *)local_80,(Vector3f *)this_02);
  ::operator-((Vector3f *)local_80,(Vector3f *)this_02);
  Vector3f::cross(v0,(Vector3f *)in_RDI);
  fVar5 = Vector3f::length((Vector3f *)0x358a96);
  *(float *)((long)&in_RDI[2]._vptr_Object + 4) = fVar5 / 2.0;
  fVar5 = *(float *)((long)&in_RDI[2]._vptr_Object + 4);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    Vector3f::normalized(this_01);
    Vector3f::operator=((Vector3f *)this_00,local_b8);
    Vector3f::normalized(this_01);
    Vector3f::operator=((Vector3f *)this_00,local_b8);
    Vector3f::normalized(this_01);
    Vector3f::operator=((Vector3f *)this_00,local_b8);
    *(undefined1 *)((long)&in_RDI[1]._vptr_Object + 1) = 1;
    uVar4 = (*in_stack_00000010->_vptr_Material[4])();
    if (((uVar4 & 1) != 0) &&
       (bVar3 = Texture::is_empty((Texture *)(in_stack_00000010 + 0x1c)), !bVar3)) {
      in_RDI->remit = 1;
    }
    uVar4 = (*in_stack_00000010->_vptr_Material[2])();
    if ((uVar4 & 1) != 0) {
      prepare_coords(unaff_retaddr);
    }
  }
  else {
    *(undefined1 *)&in_RDI[1]._vptr_Object = 1;
  }
  return;
}

Assistant:

Triangle(const Vector3f& a, const Vector3f& b, const Vector3f& c,
		const Vector3f& p, const Vector3f& q, const Vector3f& r, Material* m) :Object(m) {
		v[0] = a;
		v[1] = b;
		v[2] = c;
		area = Vector3f::cross(a - b, a - c).length() / 2;
		if (area == 0)
		{
			empty = true;
			return;
		}
		n[0] = p.normalized();
		n[1] = q.normalized();
		n[2] = r.normalized();
		use_n = true;
#ifdef TRIANGLE_REMIT
		if (m->is_brdf() && !((BRDFMaterial*)m)->emissionColor.is_empty())
			remit = 1;
#endif
		if (m->need_coords()) prepare_coords();
	}